

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuilder.cpp
# Opt level: O2

void __thiscall YAML::NodeBuilder::Push(NodeBuilder *this,node *node)

{
  pointer ppnVar1;
  element_type *peVar2;
  pointer ppVar3;
  pointer ppVar4;
  ulong uVar5;
  bool local_29;
  node *local_28;
  
  ppnVar1 = (this->m_stack).
            super__Vector_base<YAML::detail::node_*,_std::allocator<YAML::detail::node_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  local_28 = node;
  if ((((this->m_stack).
        super__Vector_base<YAML::detail::node_*,_std::allocator<YAML::detail::node_*>_>._M_impl.
        super__Vector_impl_data._M_start == ppnVar1) ||
      (peVar2 = (((ppnVar1[-1]->m_pRef).
                  super___shared_ptr<YAML::detail::node_ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                m_pData).super___shared_ptr<YAML::detail::node_data,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr, peVar2->m_isDefined != true)) || (peVar2->m_type != Map)) {
    std::vector<YAML::detail::node*,std::allocator<YAML::detail::node*>>::
    emplace_back<YAML::detail::node*>
              ((vector<YAML::detail::node*,std::allocator<YAML::detail::node*>> *)&this->m_stack,
               &local_28);
  }
  else {
    ppVar3 = (this->m_keys).
             super__Vector_base<std::pair<YAML::detail::node_*,_bool>,_std::allocator<std::pair<YAML::detail::node_*,_bool>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    ppVar4 = (this->m_keys).
             super__Vector_base<std::pair<YAML::detail::node_*,_bool>,_std::allocator<std::pair<YAML::detail::node_*,_bool>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar5 = this->m_mapDepth;
    std::vector<YAML::detail::node*,std::allocator<YAML::detail::node*>>::
    emplace_back<YAML::detail::node*>
              ((vector<YAML::detail::node*,std::allocator<YAML::detail::node*>> *)&this->m_stack,
               &local_28);
    if ((ulong)((long)ppVar3 - (long)ppVar4 >> 4) < uVar5) {
      local_29 = false;
      local_28 = node;
      std::
      vector<std::pair<YAML::detail::node*,bool>,std::allocator<std::pair<YAML::detail::node*,bool>>>
      ::emplace_back<YAML::detail::node*,bool>
                ((vector<std::pair<YAML::detail::node*,bool>,std::allocator<std::pair<YAML::detail::node*,bool>>>
                  *)&this->m_keys,&local_28,&local_29);
    }
  }
  return;
}

Assistant:

void NodeBuilder::Push(detail::node& node) {
  const bool needsKey =
      (!m_stack.empty() && m_stack.back()->type() == NodeType::Map &&
       m_keys.size() < m_mapDepth);

  m_stack.push_back(&node);
  if (needsKey)
    m_keys.emplace_back(&node, false);
}